

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AVLTree.cpp
# Opt level: O2

void __thiscall
itis::AVLTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
insert(AVLTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  bool bVar1;
  AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **indirect;
  vector<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
  path;
  _Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
  local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  path.
  super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  path.
  super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  path.
  super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (indirect = &this->root;
      *indirect !=
      (AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)0x0; indirect = &(*indirect)->right + bVar1) {
    std::
    vector<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
    ::push_back(&path,&indirect);
    bVar1 = std::operator>(&(*indirect)->value,value);
  }
  this_00 = (AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)operator_new(0x38);
  std::__cxx11::string::string((string *)&local_40,(string *)value);
  AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  AVLTreeNode(this_00,&local_40);
  *indirect = this_00;
  std::__cxx11::string::~string((string *)&local_40);
  std::
  vector<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
  ::push_back(&path,&indirect);
  std::
  vector<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
  ::vector((vector<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
            *)&local_58,&path);
  balance(this,(vector<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
                *)&local_58);
  std::
  _Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
  ::~_Vector_base(&local_58);
  this->_size = this->_size + 1;
  std::
  _Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
  ::~_Vector_base(&path.
                   super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
                 );
  return;
}

Assistant:

void AVLTree<T>::insert(T value) {
    AVLTreeNode<T> **indirect = &root;    // to generalize insertion
    std::vector<AVLTreeNode<T> **> path;  // to update height values

    while (*indirect != nullptr) {
      path.push_back(indirect);

      if ((*indirect)->value > value) {
        indirect = &((*indirect)->left);
      } else {
        indirect = &((*indirect)->right);
      }
    }

    *indirect = new AVLTreeNode<T>(value);
    path.push_back(indirect);

    balance(path);
    _size++;
  }